

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wbengine.cpp
# Opt level: O2

void __thiscall banksia::WbEngine::tickWork(WbEngine *this)

{
  int iVar1;
  size_t in_RCX;
  void *__buf;
  allocator local_31;
  string local_30 [32];
  
  Engine::tickWork((Engine *)this);
  if ((this->super_EngineProfile).super_Engine.super_Player.state == starting) {
    if (this->tick_delay_2_ready < 1) {
      if ((0x14 < (this->super_EngineProfile).super_Engine.super_Player.tick_state) &&
         ((this->super_EngineProfile).super_Engine.correctCmdCnt < 2)) {
        Player::setState((Player *)this,stopped);
        return;
      }
    }
    else {
      iVar1 = this->tick_delay_2_ready + -1;
      this->tick_delay_2_ready = iVar1;
      if (iVar1 == 0) {
        std::__cxx11::string::string(local_30,"force",&local_31);
        Engine::write((Engine *)this,(int)local_30,__buf,in_RCX);
        std::__cxx11::string::~string(local_30);
        if (this->feature_ping == true) {
          (*(this->super_EngineProfile).super_Engine.super_Player.super_Obj._vptr_Obj[0x1f])(this);
        }
        Player::setState((Player *)this,ready);
      }
    }
  }
  return;
}

Assistant:

void WbEngine::tickWork()
{
    EngineProfile::tickWork();

    if (getState() == PlayerState::starting) {
        if (tick_delay_2_ready > 0) {
            tick_delay_2_ready--;
            if (tick_delay_2_ready == 0) {
                write("force");
                if (feature_ping) {
                    sendPing();
                }
                setState(PlayerState::ready);
            }
        } else if (tick_state > 10 * 2 && correctCmdCnt < 2) {
            // crashed
            setState(PlayerState::stopped);
        }
    }
}